

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O0

void __thiscall
fineftp::FtpSession::sendFtpMessage(FtpSession *this,FtpReplyCode code,string *message)

{
  FtpMessage local_48;
  string *local_20;
  string *message_local;
  FtpSession *pFStack_10;
  FtpReplyCode code_local;
  FtpSession *this_local;
  
  local_20 = message;
  message_local._4_4_ = code;
  pFStack_10 = this;
  FtpMessage::FtpMessage(&local_48,code,message);
  sendFtpMessage(this,&local_48);
  FtpMessage::~FtpMessage(&local_48);
  return;
}

Assistant:

void FtpSession::sendFtpMessage(FtpReplyCode code, const std::string& message)
  {
    sendFtpMessage(FtpMessage(code, message));
  }